

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

Gia_Man_t * Gia_ManDupUnnormalize(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  Vec_Int_t *__ptr;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  uint uVar13;
  long lVar14;
  ulong uVar12;
  
  if (p->nBufs != 0) {
    __assert_fail("!Gia_ManBufNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x183,"Gia_Man_t *Gia_ManDupUnnormalize(Gia_Man_t *)");
  }
  __ptr = Gia_ManOrderWithBoxes(p);
  if (__ptr == (Vec_Int_t *)0x0) {
    p_00 = (Gia_Man_t *)0x0;
  }
  else {
    Gia_ManFillValue(p);
    p_00 = Gia_ManStart(p->nObjs);
    pcVar3 = p->pName;
    if (pcVar3 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar3);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar3);
    }
    p_00->pName = pcVar8;
    pcVar3 = p->pSpec;
    if (pcVar3 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      sVar7 = strlen(pcVar3);
      pcVar8 = (char *)malloc(sVar7 + 1);
      strcpy(pcVar8,pcVar3);
    }
    p_00->pSpec = pcVar8;
    if (p->pSibls != (int *)0x0) {
      piVar9 = (int *)calloc((long)p->nObjs,4);
      p_00->pSibls = piVar9;
    }
    if (0 < __ptr->nSize) {
      lVar14 = 0;
      do {
        iVar2 = __ptr->pArray[lVar14];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_00783291:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar1 = p->pObjs + iVar2;
        uVar4 = *(ulong *)pGVar1;
        uVar6 = (uint)uVar4;
        uVar11 = uVar6 & 0x1fffffff;
        uVar12 = (ulong)uVar11;
        uVar13 = (uint)(uVar4 >> 0x20);
        if ((((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar6 & 0x1fffffff) != (uVar13 & 0x1fffffff))) {
          if (uVar11 == 0x1fffffff || (int)uVar6 < 0) {
            if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
              pGVar10 = Gia_ManAppendObj(p_00);
              uVar4 = *(ulong *)pGVar10;
              *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
              *(ulong *)pGVar10 =
                   uVar4 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar5 = p_00->pObjs;
              if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_007832cf:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555
                         );
              pGVar5 = p_00->pObjs;
              if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_007832cf;
              pGVar1->Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
            }
            else {
              if ((int)uVar6 < 0 && uVar11 != 0x1fffffff) {
                if ((int)pGVar1[-uVar12].Value < 0) goto LAB_007832b0;
                uVar6 = Gia_ManAppendCo(p_00,pGVar1[-uVar12].Value ^ uVar6 >> 0x1d & 1);
                goto LAB_00783029;
              }
              if ((~uVar4 & 0x1fffffff1fffffff) != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                              ,0x19d,"Gia_Man_t *Gia_ManDupUnnormalize(Gia_Man_t *)");
              }
              pGVar1->Value = 0;
            }
          }
          else {
            if (((int)pGVar1[-uVar12].Value < 0) ||
               ((int)pGVar1[-(ulong)(uVar13 & 0x1fffffff)].Value < 0)) goto LAB_007832b0;
            uVar6 = Gia_ManAppendAnd(p_00,pGVar1[-uVar12].Value ^ (uint)(uVar4 >> 0x1d) & 1,
                                     pGVar1[-(ulong)(uVar13 & 0x1fffffff)].Value ^
                                     uVar13 >> 0x1d & 1);
            pGVar1->Value = uVar6;
            pGVar5 = p->pObjs;
            if ((pGVar1 < pGVar5) || (pGVar5 + p->nObjs <= pGVar1)) goto LAB_007832cf;
            if (p->pSibls != (int *)0x0) {
              uVar11 = p->pSibls[(int)((ulong)((long)pGVar1 - (long)pGVar5) >> 2) * -0x55555555];
              if ((ulong)uVar11 != 0) {
                if (((int)uVar11 < 0) || (p->nObjs <= (int)uVar11)) goto LAB_00783291;
                if (((int)pGVar5[uVar11].Value < 0) || ((int)uVar6 < 0)) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                p_00->pSibls[uVar6 >> 1] = pGVar5[uVar11].Value >> 1;
              }
            }
          }
        }
        else {
          if ((int)pGVar1[-uVar12].Value < 0) {
LAB_007832b0:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          uVar6 = Gia_ManAppendBuf(p_00,pGVar1[-uVar12].Value ^ uVar6 >> 0x1d & 1);
LAB_00783029:
          pGVar1->Value = uVar6;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < __ptr->nSize);
    }
    Gia_ManSetRegNum(p_00,p->nRegs);
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupUnnormalize( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( !Gia_ManBufNum(p) );
    vNodes = Gia_ManOrderWithBoxes( p );
    if ( vNodes == NULL )
        return NULL;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
                pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);        
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsConst0(pObj) )
            pObj->Value = 0;
        else assert( 0 );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vNodes );
    return pNew;
}